

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O2

void sznet::sz_sleep(int millisec)

{
  timespec local_18;
  
  local_18.tv_sec = (__time_t)(millisec / 1000);
  local_18.tv_nsec = (long)((millisec % 1000) * 1000000);
  nanosleep(&local_18,(timespec *)0x0);
  return;
}

Assistant:

void sz_sleep(int millisec)
{
#if SZ_OS_LINUX
	struct timespec ts {};
	ts.tv_sec = millisec / 1000;
	ts.tv_nsec = (millisec % 1000) * 1000000;
	nanosleep(&ts, nullptr);
#else
	Sleep(millisec);
#endif
}